

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiCommandBuffersTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_0::submitPrimaryBufferTwiceTest
          (TestStatus *__return_storage_ptr__,Context *context)

{
  VkEvent obj;
  Handle<(vk::HandleType)10> HVar1;
  VkResult VVar2;
  int iVar3;
  VkDevice device;
  DeviceInterface *vk;
  VkQueue pVVar4;
  VkSubmitInfo submitInfo;
  VkCommandBufferBeginInfo primCmdBufBeginInfo;
  VkCommandPoolCreateInfo cmdPoolParams;
  VkCommandBufferAllocateInfo cmdBufParams;
  long *local_178;
  long local_170;
  long local_168 [2];
  deUint64 local_158;
  DeviceInterface *pDStack_150;
  VkDevice local_148;
  VkAllocationCallbacks *pVStack_140;
  VkFence local_138;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_130;
  undefined4 local_118;
  undefined4 uStack_114;
  Deleter<vk::Handle<(vk::HandleType)10>_> DStack_110;
  VkCommandPool local_f8;
  Deleter<vk::Handle<(vk::HandleType)24>_> DStack_f0;
  Move<vk::Handle<(vk::HandleType)10>_> local_d8;
  undefined8 local_b8;
  undefined8 uStack_b0;
  deUint64 *local_a8;
  undefined8 uStack_a0;
  undefined8 local_98;
  undefined8 local_88;
  undefined8 uStack_80;
  undefined8 local_78;
  undefined8 uStack_70;
  VkCommandPoolCreateInfo local_68;
  VkCommandBufferAllocateInfo local_50;
  
  device = Context::getDevice(context);
  vk = Context::getDeviceInterface(context);
  pVVar4 = Context::getUniversalQueue(context);
  local_68.queueFamilyIndex = Context::getUniversalQueueFamilyIndex(context);
  local_68.sType = VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO;
  local_68.pNext = (void *)0x0;
  local_68.flags = 2;
  ::vk::createCommandPool
            ((Move<vk::Handle<(vk::HandleType)24>_> *)&local_d8,vk,device,&local_68,
             (VkAllocationCallbacks *)0x0);
  DStack_f0.m_device =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_f8.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_f0.m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_50.sType = VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO;
  local_50.pNext = (void *)0x0;
  local_50.commandPool.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  local_50.level = VK_COMMAND_BUFFER_LEVEL_PRIMARY;
  local_50.commandBufferCount = 1;
  ::vk::allocateCommandBuffer((Move<vk::VkCommandBuffer_s_*> *)&local_d8,vk,device,&local_50);
  local_148 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device;
  pVStack_140 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator;
  local_158 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  pDStack_150 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface
  ;
  local_78 = 0;
  uStack_70 = 0;
  local_88 = 0x2a;
  uStack_80 = 0;
  ::vk::createEvent(&local_d8,vk,device,0,(VkAllocationCallbacks *)0x0);
  DStack_110.m_device._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_110.m_device._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_110.m_allocator._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_110.m_allocator._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_118 = (undefined4)
              local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  uStack_114 = local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal.
               _4_4_;
  DStack_110.m_deviceIface._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._0_4_;
  DStack_110.m_deviceIface._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface._4_4_;
  VVar2 = (*vk->_vptr_DeviceInterface[0x1d])
                    (vk,device,
                     local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.
                     m_internal);
  ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x65f);
  VVar2 = (*vk->_vptr_DeviceInterface[0x49])(vk,local_158,&local_88);
  ::vk::checkResult(VVar2,"vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x662);
  (*vk->_vptr_DeviceInterface[0x6a])(vk,local_158,CONCAT44(uStack_114,local_118),0x10000);
  VVar2 = (*vk->_vptr_DeviceInterface[0x4a])(vk,local_158);
  ::vk::checkResult(VVar2,"vk.endCommandBuffer(*primCmdBuf)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x66a);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)&local_d8,vk,device,0,
                    (VkAllocationCallbacks *)0x0);
  HVar1.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_130.m_device._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._0_4_;
  DStack_130.m_device._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device._4_4_;
  DStack_130.m_allocator._0_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._0_4_;
  DStack_130.m_allocator._4_4_ =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator._4_4_;
  local_138.m_internal =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal;
  DStack_130.m_deviceIface =
       local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_b8 = 0;
  uStack_a0 = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_device = (VkDevice)0x0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.deleter.m_allocator =
       (VkAllocationCallbacks *)0x0;
  local_98 = 0;
  local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = 4;
  uStack_b0 = 1;
  local_a8 = &local_158;
  VVar2 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar4,1,&local_d8,HVar1.m_internal);
  ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x67d);
  VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_138,0,0xffffffffffffffff);
  ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x680);
  VVar2 = (*vk->_vptr_DeviceInterface[0x14])(vk,device,1,&local_138);
  ::vk::checkResult(VVar2,"vk.resetFences(vkDevice, 1u, &fence.get())",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                    ,0x681);
  iVar3 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,CONCAT44(uStack_114,local_118));
  if (iVar3 == 3) {
    VVar2 = (*vk->_vptr_DeviceInterface[0x1d])(vk,device,CONCAT44(uStack_114,local_118));
    ::vk::checkResult(VVar2,"vk.resetEvent(vkDevice, *event)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x688);
    VVar2 = (*vk->_vptr_DeviceInterface[2])(vk,pVVar4,1,&local_d8,local_138.m_internal);
    ::vk::checkResult(VVar2,"vk.queueSubmit(queue, 1u, &submitInfo, *fence)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x68a);
    VVar2 = (*vk->_vptr_DeviceInterface[0x16])(vk,device,1,&local_138,0,0xffffffffffffffff);
    ::vk::checkResult(VVar2,"vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/external/vulkancts/modules/vulkan/api/vktApiCommandBuffersTests.cpp"
                      ,0x68d);
    iVar3 = (*vk->_vptr_DeviceInterface[0x1b])(vk,device,CONCAT44(uStack_114,local_118));
    local_178 = local_168;
    if (iVar3 == 3) {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"Submit Twice Test succeeded","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_PASS;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_178,
                 local_170 + (long)local_178);
    }
    else {
      std::__cxx11::string::_M_construct<char_const*>
                ((string *)&local_178,"Submit Twice Test FAILED","");
      __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
      (__return_storage_ptr__->m_description)._M_dataplus._M_p =
           (pointer)&(__return_storage_ptr__->m_description).field_2;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&__return_storage_ptr__->m_description,local_178,
                 local_170 + (long)local_178);
    }
  }
  else {
    local_178 = local_168;
    std::__cxx11::string::_M_construct<char_const*>
              ((string *)&local_178,"Submit Twice Test FAILED","");
    __return_storage_ptr__->m_code = QP_TEST_RESULT_FAIL;
    (__return_storage_ptr__->m_description)._M_dataplus._M_p =
         (pointer)&(__return_storage_ptr__->m_description).field_2;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&__return_storage_ptr__->m_description,local_178,
               local_170 + (long)local_178);
  }
  if (local_178 != local_168) {
    operator_delete(local_178,local_168[0] + 1);
  }
  if (local_138.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_130,local_138);
  }
  obj.m_internal._4_4_ = uStack_114;
  obj.m_internal._0_4_ = local_118;
  if (obj.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)10>_>::operator()(&DStack_110,obj);
  }
  if (local_158 != 0) {
    local_d8.super_RefBase<vk::Handle<(vk::HandleType)10>_>.m_data.object.m_internal = local_158;
    (*pDStack_150->_vptr_DeviceInterface[0x48])(pDStack_150,local_148,pVStack_140,1);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)24>_>::operator()(&DStack_f0,local_f8);
  }
  return __return_storage_ptr__;
}

Assistant:

tcu::TestStatus submitPrimaryBufferTwiceTest(Context& context)
{

	const VkDevice							vkDevice				= context.getDevice();
	const DeviceInterface&					vk						= context.getDeviceInterface();
	const VkQueue							queue					= context.getUniversalQueue();
	const deUint32							queueFamilyIndex		= context.getUniversalQueueFamilyIndex();

	const VkCommandPoolCreateInfo			cmdPoolParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_POOL_CREATE_INFO,					//	VkStructureType				sType;
		DE_NULL,													//	const void*					pNext;
		VK_COMMAND_POOL_CREATE_RESET_COMMAND_BUFFER_BIT,			//	VkCommandPoolCreateFlags	flags;
		queueFamilyIndex,											//	deUint32					queueFamilyIndex;
	};
	const Unique<VkCommandPool>				cmdPool					(createCommandPool(vk, vkDevice, &cmdPoolParams));

	// Command buffer
	const VkCommandBufferAllocateInfo		cmdBufParams			=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_ALLOCATE_INFO,				//	VkStructureType			sType;
		DE_NULL,													//	const void*				pNext;
		*cmdPool,													//	VkCommandPool				pool;
		VK_COMMAND_BUFFER_LEVEL_PRIMARY,							//	VkCommandBufferLevel		level;
		1u,															//	uint32_t					bufferCount;
	};
	const Unique<VkCommandBuffer>			primCmdBuf				(allocateCommandBuffer(vk, vkDevice, &cmdBufParams));
	const VkCommandBufferBeginInfo			primCmdBufBeginInfo		=
	{
		VK_STRUCTURE_TYPE_COMMAND_BUFFER_BEGIN_INFO,
		DE_NULL,
		0,															// flags
		(const VkCommandBufferInheritanceInfo*)DE_NULL,
	};

	// create event that will be used to check if secondary command buffer has been executed
	const Unique<VkEvent>					event					(createEvent(vk, vkDevice));

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	// record primary command buffer
	VK_CHECK(vk.beginCommandBuffer(*primCmdBuf, &primCmdBufBeginInfo));
	{
		// allow execution of event during every stage of pipeline
		VkPipelineStageFlags stageMask = VK_PIPELINE_STAGE_ALL_COMMANDS_BIT;

		// record setting event
		vk.cmdSetEvent(*primCmdBuf, *event,stageMask);
	}
	VK_CHECK(vk.endCommandBuffer(*primCmdBuf));

	// create fence to wait for execution of queue
	const Unique<VkFence>					fence					(createFence(vk, vkDevice));

	const VkSubmitInfo						submitInfo				=
	{
		VK_STRUCTURE_TYPE_SUBMIT_INFO,								// sType
		DE_NULL,													// pNext
		0u,															// waitSemaphoreCount
		DE_NULL,													// pWaitSemaphores
		(const VkPipelineStageFlags*)DE_NULL,						// pWaitDstStageMask
		1,															// commandBufferCount
		&primCmdBuf.get(),											// pCommandBuffers
		0u,															// signalSemaphoreCount
		DE_NULL,													// pSignalSemaphores
	};

	// submit primary buffer
	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));
	VK_CHECK(vk.resetFences(vkDevice, 1u, &fence.get()));
	// check if buffer has been executed
	VkResult result = vk.getEventStatus(vkDevice,*event);
	if (result != VK_EVENT_SET)
		return tcu::TestStatus::fail("Submit Twice Test FAILED");

	// reset event
	VK_CHECK(vk.resetEvent(vkDevice, *event));

	VK_CHECK(vk.queueSubmit(queue, 1u, &submitInfo, *fence));

	// wait for end of execution of queue
	VK_CHECK(vk.waitForFences(vkDevice, 1, &fence.get(), 0u, INFINITE_TIMEOUT));

	// check if buffer has been executed
	result = vk.getEventStatus(vkDevice,*event);
	if (result != VK_EVENT_SET)
		return tcu::TestStatus::fail("Submit Twice Test FAILED");
	else
		return tcu::TestStatus::pass("Submit Twice Test succeeded");
}